

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

int recff_metacall(jit_State *J,RecordFFData *rd,MMS mm)

{
  int iVar1;
  long *in_RSI;
  long in_RDI;
  TValue argv0;
  int errcode;
  RecordIndex ix;
  int in_stack_ffffffffffffff0c;
  lua_State *L;
  undefined8 local_c8 [3];
  undefined4 local_b0;
  undefined4 local_a0;
  long *local_90;
  long local_88;
  int local_7c;
  undefined1 *local_78;
  undefined8 *local_70;
  undefined8 local_68;
  undefined8 *local_60;
  undefined8 *local_58;
  undefined8 local_50;
  undefined8 in_stack_ffffffffffffffb8;
  RecordIndex *in_stack_ffffffffffffffc0;
  jit_State *in_stack_ffffffffffffffc8;
  
  local_b0 = **(undefined4 **)(in_RDI + 0x80);
  local_90 = in_RSI;
  local_88 = in_RDI;
  iVar1 = lj_record_mm_lookup(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                              (MMS)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
  if (iVar1 == 0) {
    local_7c = 0;
  }
  else {
    *(undefined4 *)(*(long *)(local_88 + 0x80) + 4) = **(undefined4 **)(local_88 + 0x80);
    **(undefined4 **)(local_88 + 0x80) = local_a0;
    L = *(lua_State **)*local_90;
    *(undefined8 *)(*local_90 + 8) = *(undefined8 *)*local_90;
    local_50 = *(undefined8 *)(local_88 + 0x60);
    local_58 = (undefined8 *)*local_90;
    local_60 = local_c8;
    *local_58 = local_c8[0];
    iVar1 = lj_vm_cpcall(*(undefined8 *)(local_88 + 0x60),0,local_88,recff_metacall_cp);
    local_68 = *(undefined8 *)(local_88 + 0x60);
    local_70 = (undefined8 *)*local_90;
    local_78 = &stack0xffffffffffffff10;
    *local_70 = L;
    if (iVar1 != 0) {
      lj_err_throw(L,in_stack_ffffffffffffff0c);
    }
    local_90[1] = -1;
    local_7c = 1;
  }
  return local_7c;
}

Assistant:

static int recff_metacall(jit_State *J, RecordFFData *rd, MMS mm)
{
  RecordIndex ix;
  ix.tab = J->base[0];
  copyTV(J->L, &ix.tabv, &rd->argv[0]);
  if (lj_record_mm_lookup(J, &ix, mm)) {  /* Has metamethod? */
    int errcode;
    TValue argv0;
    /* Temporarily insert metamethod below object. */
    J->base[1] = J->base[0];
    J->base[0] = ix.mobj;
    copyTV(J->L, &argv0, &rd->argv[0]);
    copyTV(J->L, &rd->argv[1], &rd->argv[0]);
    copyTV(J->L, &rd->argv[0], &ix.mobjv);
    /* Need to protect lj_record_tailcall because it may throw. */
    errcode = lj_vm_cpcall(J->L, NULL, J, recff_metacall_cp);
    /* Always undo Lua stack changes to avoid confusing the interpreter. */
    copyTV(J->L, &rd->argv[0], &argv0);
    if (errcode)
      lj_err_throw(J->L, errcode);  /* Propagate errors. */
    rd->nres = -1;  /* Pending call. */
    return 1;  /* Tailcalled to metamethod. */
  }
  return 0;
}